

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::merkle_tree::merkle_tree
          (merkle_tree *this,int num_blocks,int blocks_per_piece,char *r)

{
  uchar uVar1;
  uint v;
  int v_00;
  char *r_local;
  int blocks_per_piece_local;
  int num_blocks_local;
  merkle_tree *this_local;
  
  this->m_root = r;
  container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  ::container_wrapper(&this->m_tree);
  bitfield::bitfield(&this->m_block_verified);
  this->m_num_blocks = num_blocks;
  v = numeric_cast<unsigned_int,int,void>(blocks_per_piece);
  v_00 = log2p1(v);
  uVar1 = numeric_cast<unsigned_char,int,void>(v_00);
  this->m_blocks_per_piece_log = uVar1;
  this->m_mode = empty_tree;
  return;
}

Assistant:

merkle_tree::merkle_tree(int const num_blocks, int const blocks_per_piece, char const* r)
		: m_root(r)
		, m_num_blocks(num_blocks)
		, m_blocks_per_piece_log(numeric_cast<std::uint8_t>(
			log2p1(numeric_cast<std::uint32_t>(blocks_per_piece))))
		, m_mode(mode_t::empty_tree)
	{
		INVARIANT_CHECK;

		// blocks per piece must be an even power of 2
		TORRENT_ASSERT(((blocks_per_piece - 1) & blocks_per_piece) == 0);
		TORRENT_ASSERT(m_root != nullptr);
		TORRENT_ASSERT(this->blocks_per_piece() == blocks_per_piece);
	}